

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Join_Cmd.cpp
# Opt level: O1

bool __thiscall SRUP_MSG_JOIN_CMD::DeSerialize(SRUP_MSG_JOIN_CMD *this,uchar *serial_data)

{
  uint64_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint64_t *puVar4;
  uint8_t *puVar5;
  ulong __n;
  uint8_t bytes [2];
  undefined2 local_2a;
  
  *(this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_version = *serial_data;
  *(this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_msgtype = serial_data[1];
  uVar1 = *(uint64_t *)(serial_data + 2);
  puVar4 = (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_sequence_ID;
  if (puVar4 != (uint64_t *)0x0) {
    operator_delete(puVar4);
  }
  puVar4 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_sequence_ID = puVar4;
  *puVar4 = uVar1;
  uVar1 = *(uint64_t *)(serial_data + 10);
  puVar4 = (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_sender_ID;
  if (puVar4 != (uint64_t *)0x0) {
    operator_delete(puVar4);
  }
  puVar4 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_sender_ID = puVar4;
  *puVar4 = uVar1;
  local_2a = *(undefined2 *)(serial_data + 0x12);
  uVar2 = SRUP_MSG::decodeLength((uint8_t *)&local_2a);
  puVar5 = (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_token;
  if (puVar5 != (uint8_t *)0x0) {
    operator_delete__(puVar5);
  }
  puVar5 = (uint8_t *)operator_new__((ulong)(uVar2 + 1));
  (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_token = puVar5;
  memcpy(puVar5,serial_data + 0x14,(ulong)uVar2);
  (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_token_len = uVar2;
  local_2a = *(undefined2 *)(serial_data + (ulong)uVar2 + 0x14);
  uVar3 = SRUP_MSG::decodeLength((uint8_t *)&local_2a);
  (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_sig_len = uVar3;
  puVar5 = (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_signature;
  if (puVar5 != (uint8_t *)0x0) {
    operator_delete__(puVar5);
  }
  __n = (ulong)uVar3;
  puVar5 = (uint8_t *)operator_new__(__n);
  (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_signature = puVar5;
  memcpy(puVar5,serial_data + (uVar2 + 0x16),__n);
  uVar1 = *(uint64_t *)(serial_data + (uVar2 + 0x16) + __n);
  if (this->m_device_id != (uint64_t *)0x0) {
    operator_delete(this->m_device_id);
  }
  puVar4 = (uint64_t *)operator_new(8);
  this->m_device_id = puVar4;
  *puVar4 = uVar1;
  return true;
}

Assistant:

bool SRUP_MSG_JOIN_CMD::DeSerialize(const unsigned char* serial_data)
{
    uint16_t x;
    uint32_t p=0;
    uint8_t bytes[2];

    // We need to unmarshall the data to reconstruct the object...
    // We can start with the two bytes for the header.
    // One for the version - and one for the message type.

    std::memcpy(m_version, (uint8_t*) serial_data, 1);
    p+=1;
    std::memcpy(m_msgtype, (uint8_t*) serial_data + p, 1);
    p+=1;

    // Now we have to unmarshall the sequence ID...
    uint8_t sid_bytes[8];
    for (unsigned char & sid_byte : sid_bytes)
    {
        std::memcpy(&sid_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sequence_ID
    if (m_sequence_ID != nullptr)
        delete(m_sequence_ID);
    m_sequence_ID = new uint64_t;
    std::memcpy(m_sequence_ID, sid_bytes, 8);

    // ...and also for the sender_ID
    uint8_t snd_bytes[8];
    for (unsigned char & snd_byte : snd_bytes)
    {
        std::memcpy(&snd_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    if (m_sender_ID!= nullptr)
        delete(m_sender_ID);
    m_sender_ID = new uint64_t;
    std::memcpy(m_sender_ID, snd_bytes, 8);

    // Now we have two-bytes for the size of the token ... and x bytes for the token
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    delete[] m_token;
    m_token = new uint8_t[x+1];
    std::memcpy(m_token, (char*) serial_data + p, x);
    m_token_len = x;
    p+=x;

    // The next two bytes are the size of the signature...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    m_sig_len = x;

    // The next x bytes are the value of the signature.
    delete[] m_signature;
    m_signature = new unsigned char[x];
    std::memcpy(m_signature, serial_data + p, x);
    p+=x;

    // Lastly we have to unmarshall the device ID...
    uint8_t dev_bytes[8];
    for (unsigned char & dev_byte : dev_bytes)
    {
        std::memcpy(&dev_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into the device ID
    if (m_device_id != nullptr)
        delete(m_device_id);
    m_device_id = new uint64_t;
    std::memcpy(m_device_id, dev_bytes, 8);

    return true;
}